

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anonymizer.cpp
# Opt level: O0

void process_string_table(section *s,string *filename)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ostream *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__s;
  undefined4 extraout_var_01;
  long lVar4;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string str;
  size_t index;
  string *filename_local;
  section *s_local;
  
  this = std::operator<<((ostream *)&std::cout,"Info: processing string table section");
  std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  str.field_2._8_8_ = 1;
  while (uVar1 = str.field_2._8_8_, iVar3 = (*s->_vptr_section[0x13])(),
        (ulong)uVar1 < CONCAT44(extraout_var,iVar3)) {
    iVar3 = (*s->_vptr_section[0x18])();
    __s = (char *)(CONCAT44(extraout_var_00,iVar3) + str.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,__s,&local_41);
    std::allocator<char>::~allocator(&local_41);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"main");
    if (bVar2) {
      iVar3 = (*s->_vptr_section[0x17])();
      overwrite_data(filename,CONCAT44(extraout_var_01,iVar3) + str.field_2._8_8_,(string *)local_40
                    );
    }
    lVar4 = std::__cxx11::string::length();
    str.field_2._8_8_ = lVar4 + 1 + str.field_2._8_8_;
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void process_string_table( const section* s, const std::string& filename )
{
    std::cout << "Info: processing string table section" << std::endl;
    size_t index = 1;
    while ( index < s->get_size() ) {
        auto str = std::string( s->get_data() + index );
        // For the example purpose, we rename main function name only
        if ( str == "main" )
            overwrite_data( filename, s->get_offset() + index, str );
        index += str.length() + 1;
    }
}